

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

int qpdf_find_page_by_oh(qpdf_data qpdf,qpdf_oh oh)

{
  qpdf_oh oh_00;
  qpdf_data qpdf_00;
  int iVar1;
  anon_class_8_1_8990bbdf local_68;
  function<int_(QPDFObjectHandle_&)> local_60;
  int local_3c;
  function<int_()> local_38;
  qpdf_oh local_14;
  qpdf_data p_Stack_10;
  qpdf_oh oh_local;
  qpdf_data qpdf_local;
  
  local_14 = oh;
  p_Stack_10 = qpdf;
  QTC::TC("qpdf","qpdf-c called qpdf_find_page_by_oh",0);
  qpdf_00 = p_Stack_10;
  oh_00 = local_14;
  local_3c = -1;
  return_T<int>(&local_38,&local_3c);
  local_68.qpdf = p_Stack_10;
  std::function<int(QPDFObjectHandle&)>::function<qpdf_find_page_by_oh::__0,void>
            ((function<int(QPDFObjectHandle&)> *)&local_60,&local_68);
  iVar1 = do_with_oh<int>(qpdf_00,oh_00,&local_38,&local_60);
  std::function<int_(QPDFObjectHandle_&)>::~function(&local_60);
  std::function<int_()>::~function(&local_38);
  return iVar1;
}

Assistant:

int
qpdf_find_page_by_oh(qpdf_data qpdf, qpdf_oh oh)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_find_page_by_oh");
    return do_with_oh<int>(qpdf, oh, return_T<int>(-1), [qpdf](QPDFObjectHandle& o) {
        return qpdf->qpdf->findPage(o);
    });
}